

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Type __thiscall wasm::TranslateToFuzzReader::getTupleType(TranslateToFuzzReader *this)

{
  char cVar1;
  uint32_t uVar2;
  BasicType BVar3;
  ulong uVar4;
  Type local_58;
  Type local_50;
  Type type;
  pointer pTStack_40;
  
  type.id = 0;
  pTStack_40 = (pointer)0x0;
  uVar2 = Random::upTo(&this->random,(this->fuzzParams->super_FuzzParams).MAX_TUPLE_SIZE - 1);
  uVar4 = (ulong)(uVar2 + 2);
  if (uVar2 + 2 != 0) {
    do {
      local_50 = getSingleConcreteType(this);
      cVar1 = wasm::Type::isDefaultable();
      if (cVar1 != '\0') {
        if (pTStack_40 == (pointer)0x0) {
          std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                    ((vector<wasm::Type,std::allocator<wasm::Type>> *)&type,(iterator)0x0,&local_50)
          ;
        }
        else {
          pTStack_40->id = local_50.id;
          pTStack_40 = pTStack_40 + 1;
        }
      }
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    if (8 < (long)pTStack_40 - type.id) goto LAB_0014c1fa;
  }
  do {
    BVar3 = Random::
            pick<wasm::Type::BasicType,wasm::Type::BasicType,wasm::Type::BasicType,wasm::Type::BasicType>
                      (&this->random,i32,i64,f32,f64);
    local_50.id = (uintptr_t)BVar3;
    if (pTStack_40 == (pointer)0x0) {
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&type,(iterator)0x0,&local_50);
    }
    else {
      pTStack_40->id = local_50.id;
      pTStack_40 = pTStack_40 + 1;
    }
  } while ((long)pTStack_40 - type.id < 9);
LAB_0014c1fa:
  wasm::Type::Type(&local_58,(vector *)&type);
  if (type.id != 0) {
    operator_delete((void *)type.id,-type.id);
  }
  return (Type)local_58.id;
}

Assistant:

Type TranslateToFuzzReader::getTupleType() {
  std::vector<Type> elements;
  size_t maxElements = 2 + upTo(fuzzParams->MAX_TUPLE_SIZE - 1);
  for (size_t i = 0; i < maxElements; ++i) {
    auto type = getSingleConcreteType();
    // Don't add a non-defaultable type into a tuple, as currently we can't
    // spill them into locals (that would require a "let").
    if (type.isDefaultable()) {
      elements.push_back(type);
    }
  }
  while (elements.size() < 2) {
    elements.push_back(getMVPType());
  }
  return Type(elements);
}